

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_writer_init_error(mpack_writer_t *writer,mpack_error_t error)

{
  writer->version = mpack_version_current;
  writer->flush = (mpack_writer_flush_t)0x0;
  writer->error_fn = (mpack_writer_error_t)0x0;
  writer->teardown = (mpack_writer_teardown_t)0x0;
  writer->context = (void *)0x0;
  writer->buffer = (char *)0x0;
  writer->current = (char *)0x0;
  writer->end = (char *)0x0;
  writer->error = error;
  return;
}

Assistant:

static void mpack_writer_clear(mpack_writer_t* writer) {
    #if MPACK_COMPATIBILITY
    writer->version = mpack_version_current;
    #endif
    writer->flush = NULL;
    writer->error_fn = NULL;
    writer->teardown = NULL;
    writer->context = NULL;

    writer->buffer = NULL;
    writer->current = NULL;
    writer->end = NULL;
    writer->error = mpack_ok;

    #if MPACK_WRITE_TRACKING
    mpack_memset(&writer->track, 0, sizeof(writer->track));
    #endif
}